

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part_specifier.cpp
# Opt level: O1

bool duckdb::TryGetDatePartSpecifier(string *specifier_p,DatePartSpecifier *result)

{
  int iVar1;
  bool bVar2;
  DatePartSpecifier DVar3;
  string specifier;
  string local_38;
  
  StringUtil::Lower(&local_38,specifier_p);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 == 0) {
LAB_002811d1:
    DVar3 = BEGIN_BIGINT;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) goto LAB_002811d1;
    iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) goto LAB_002811d1;
    iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) goto LAB_002811d1;
    iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
    if (iVar1 == 0) goto LAB_002811d1;
    iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
    DVar3 = MONTH;
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
      if (iVar1 != 0) {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
        if (iVar1 != 0) {
          iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
          if (iVar1 != 0) {
            iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
            DVar3 = DAY;
            if (iVar1 != 0) {
              iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
              if (iVar1 != 0) {
                iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                if (iVar1 != 0) {
                  iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                  if (iVar1 != 0) {
                    iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                    DVar3 = DECADE;
                    if (iVar1 != 0) {
                      iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                      if (iVar1 != 0) {
                        iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                        if (iVar1 != 0) {
                          iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                          if (iVar1 != 0) {
                            iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                            DVar3 = CENTURY;
                            if (iVar1 != 0) {
                              iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                              if (iVar1 != 0) {
                                iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                                if (iVar1 != 0) {
                                  iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                                  if (iVar1 != 0) {
                                    iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                                    DVar3 = MILLENNIUM;
                                    if (iVar1 != 0) {
                                      iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                                      if (iVar1 != 0) {
                                        iVar1 = ::std::__cxx11::string::compare((char *)&local_38);
                                        if (iVar1 != 0) {
                                          iVar1 = ::std::__cxx11::string::compare((char *)&local_38)
                                          ;
                                          if (iVar1 != 0) {
                                            iVar1 = ::std::__cxx11::string::compare
                                                              ((char *)&local_38);
                                            if (iVar1 != 0) {
                                              iVar1 = ::std::__cxx11::string::compare
                                                                ((char *)&local_38);
                                              if (iVar1 != 0) {
                                                iVar1 = ::std::__cxx11::string::compare
                                                                  ((char *)&local_38);
                                                DVar3 = MICROSECONDS;
                                                if (iVar1 != 0) {
                                                  iVar1 = ::std::__cxx11::string::compare
                                                                    ((char *)&local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = ::std::__cxx11::string::compare
                                                                      ((char *)&local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = ::std::__cxx11::string::compare
                                                                        ((char *)&local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = ::std::__cxx11::string::compare
                                                                          ((char *)&local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = ::std::__cxx11::string::compare
                                                                            ((char *)&local_38);
                                                          if (iVar1 != 0) {
                                                            iVar1 = ::std::__cxx11::string::compare
                                                                              ((char *)&local_38);
                                                            if (iVar1 != 0) {
                                                              iVar1 = ::std::__cxx11::string::
                                                                      compare((char *)&local_38);
                                                              DVar3 = MILLISECONDS;
                                                              if (iVar1 != 0) {
                                                                iVar1 = ::std::__cxx11::string::
                                                                        compare((char *)&local_38);
                                                                if (iVar1 != 0) {
                                                                  iVar1 = ::std::__cxx11::string::
                                                                          compare((char *)&local_38)
                                                                  ;
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = ::std::__cxx11::string::
                                                                            compare((char *)&
                                                  local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = ::std::__cxx11::string::compare
                                                                      ((char *)&local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = ::std::__cxx11::string::compare
                                                                        ((char *)&local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = ::std::__cxx11::string::compare
                                                                          ((char *)&local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = ::std::__cxx11::string::compare
                                                                            ((char *)&local_38);
                                                          DVar3 = SECOND;
                                                          if (iVar1 != 0) {
                                                            iVar1 = ::std::__cxx11::string::compare
                                                                              ((char *)&local_38);
                                                            if (iVar1 != 0) {
                                                              iVar1 = ::std::__cxx11::string::
                                                                      compare((char *)&local_38);
                                                              if (iVar1 != 0) {
                                                                iVar1 = ::std::__cxx11::string::
                                                                        compare((char *)&local_38);
                                                                if (iVar1 != 0) {
                                                                  iVar1 = ::std::__cxx11::string::
                                                                          compare((char *)&local_38)
                                                                  ;
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = ::std::__cxx11::string::
                                                                            compare((char *)&
                                                  local_38);
                                                  DVar3 = MINUTE;
                                                  if (iVar1 != 0) {
                                                    iVar1 = ::std::__cxx11::string::compare
                                                                      ((char *)&local_38);
                                                    if (iVar1 != 0) {
                                                      iVar1 = ::std::__cxx11::string::compare
                                                                        ((char *)&local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = ::std::__cxx11::string::compare
                                                                          ((char *)&local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = ::std::__cxx11::string::compare
                                                                            ((char *)&local_38);
                                                          if (iVar1 != 0) {
                                                            iVar1 = ::std::__cxx11::string::compare
                                                                              ((char *)&local_38);
                                                            DVar3 = HOUR;
                                                            if (iVar1 != 0) {
                                                              iVar1 = ::std::__cxx11::string::
                                                                      compare((char *)&local_38);
                                                              if (iVar1 != 0) {
                                                                iVar1 = ::std::__cxx11::string::
                                                                        compare((char *)&local_38);
                                                                if (iVar1 != 0) {
                                                                  iVar1 = ::std::__cxx11::string::
                                                                          compare((char *)&local_38)
                                                                  ;
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = ::std::__cxx11::string::
                                                                            compare((char *)&
                                                  local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = ::std::__cxx11::string::compare
                                                                      ((char *)&local_38);
                                                    if (iVar1 == 0) {
                                                      DVar3 = BEGIN_DOUBLE;
                                                    }
                                                    else {
                                                      iVar1 = ::std::__cxx11::string::compare
                                                                        ((char *)&local_38);
                                                      DVar3 = DOW;
                                                      if (iVar1 != 0) {
                                                        iVar1 = ::std::__cxx11::string::compare
                                                                          ((char *)&local_38);
                                                        if (iVar1 != 0) {
                                                          iVar1 = ::std::__cxx11::string::compare
                                                                            ((char *)&local_38);
                                                          if (iVar1 != 0) {
                                                            iVar1 = ::std::__cxx11::string::compare
                                                                              ((char *)&local_38);
                                                            if (iVar1 == 0) {
                                                              DVar3 = ISODOW;
                                                            }
                                                            else {
                                                              iVar1 = ::std::__cxx11::string::
                                                                      compare((char *)&local_38);
                                                              DVar3 = WEEK;
                                                              if (iVar1 != 0) {
                                                                iVar1 = ::std::__cxx11::string::
                                                                        compare((char *)&local_38);
                                                                if (iVar1 != 0) {
                                                                  iVar1 = ::std::__cxx11::string::
                                                                          compare((char *)&local_38)
                                                                  ;
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = ::std::__cxx11::string::
                                                                            compare((char *)&
                                                  local_38);
                                                  if (iVar1 != 0) {
                                                    iVar1 = ::std::__cxx11::string::compare
                                                                      ((char *)&local_38);
                                                    DVar3 = DOY;
                                                    if (iVar1 != 0) {
                                                      iVar1 = ::std::__cxx11::string::compare
                                                                        ((char *)&local_38);
                                                      if (iVar1 != 0) {
                                                        iVar1 = ::std::__cxx11::string::compare
                                                                          ((char *)&local_38);
                                                        DVar3 = QUARTER;
                                                        if (iVar1 != 0) {
                                                          iVar1 = ::std::__cxx11::string::compare
                                                                            ((char *)&local_38);
                                                          if (iVar1 != 0) {
                                                            iVar1 = ::std::__cxx11::string::compare
                                                                              ((char *)&local_38);
                                                            if (iVar1 == 0) {
                                                              DVar3 = YEARWEEK;
                                                            }
                                                            else {
                                                              iVar1 = ::std::__cxx11::string::
                                                                      compare((char *)&local_38);
                                                              if (iVar1 == 0) {
                                                                DVar3 = ISOYEAR;
                                                              }
                                                              else {
                                                                iVar1 = ::std::__cxx11::string::
                                                                        compare((char *)&local_38);
                                                                if (iVar1 == 0) {
                                                                  DVar3 = ERA;
                                                                }
                                                                else {
                                                                  iVar1 = ::std::__cxx11::string::
                                                                          compare((char *)&local_38)
                                                                  ;
                                                                  if (iVar1 == 0) {
                                                                    DVar3 = TIMEZONE;
                                                                  }
                                                                  else {
                                                                    iVar1 = ::std::__cxx11::string::
                                                                            compare((char *)&
                                                  local_38);
                                                  if (iVar1 == 0) {
                                                    DVar3 = TIMEZONE_HOUR;
                                                  }
                                                  else {
                                                    iVar1 = ::std::__cxx11::string::compare
                                                                      ((char *)&local_38);
                                                    if (iVar1 == 0) {
                                                      DVar3 = TIMEZONE_MINUTE;
                                                    }
                                                    else {
                                                      iVar1 = ::std::__cxx11::string::compare
                                                                        ((char *)&local_38);
                                                      DVar3 = JULIAN_DAY;
                                                      if (iVar1 != 0) {
                                                        iVar1 = ::std::__cxx11::string::compare
                                                                          ((char *)&local_38);
                                                        if (iVar1 != 0) {
                                                          bVar2 = false;
                                                          goto LAB_002811d8;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *result = DVar3;
  bVar2 = true;
LAB_002811d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool TryGetDatePartSpecifier(const string &specifier_p, DatePartSpecifier &result) {
	auto specifier = StringUtil::Lower(specifier_p);
	if (specifier == "year" || specifier == "yr" || specifier == "y" || specifier == "years" || specifier == "yrs") {
		result = DatePartSpecifier::YEAR;
	} else if (specifier == "month" || specifier == "mon" || specifier == "months" || specifier == "mons") {
		result = DatePartSpecifier::MONTH;
	} else if (specifier == "day" || specifier == "days" || specifier == "d" || specifier == "dayofmonth") {
		result = DatePartSpecifier::DAY;
	} else if (specifier == "decade" || specifier == "dec" || specifier == "decades" || specifier == "decs") {
		result = DatePartSpecifier::DECADE;
	} else if (specifier == "century" || specifier == "cent" || specifier == "centuries" || specifier == "c") {
		result = DatePartSpecifier::CENTURY;
	} else if (specifier == "millennium" || specifier == "mil" || specifier == "millenniums" ||
	           specifier == "millennia" || specifier == "mils" || specifier == "millenium") {
		result = DatePartSpecifier::MILLENNIUM;
	} else if (specifier == "microseconds" || specifier == "microsecond" || specifier == "us" || specifier == "usec" ||
	           specifier == "usecs" || specifier == "usecond" || specifier == "useconds") {
		result = DatePartSpecifier::MICROSECONDS;
	} else if (specifier == "milliseconds" || specifier == "millisecond" || specifier == "ms" || specifier == "msec" ||
	           specifier == "msecs" || specifier == "msecond" || specifier == "mseconds") {
		result = DatePartSpecifier::MILLISECONDS;
	} else if (specifier == "second" || specifier == "sec" || specifier == "seconds" || specifier == "secs" ||
	           specifier == "s") {
		result = DatePartSpecifier::SECOND;
	} else if (specifier == "minute" || specifier == "min" || specifier == "minutes" || specifier == "mins" ||
	           specifier == "m") {
		result = DatePartSpecifier::MINUTE;
	} else if (specifier == "hour" || specifier == "hr" || specifier == "hours" || specifier == "hrs" ||
	           specifier == "h") {
		result = DatePartSpecifier::HOUR;
	} else if (specifier == "epoch") {
		// seconds since 1970-01-01
		result = DatePartSpecifier::EPOCH;
	} else if (specifier == "dow" || specifier == "dayofweek" || specifier == "weekday") {
		// day of the week (Sunday = 0, Saturday = 6)
		result = DatePartSpecifier::DOW;
	} else if (specifier == "isodow") {
		// isodow (Monday = 1, Sunday = 7)
		result = DatePartSpecifier::ISODOW;
	} else if (specifier == "week" || specifier == "weeks" || specifier == "w" || specifier == "weekofyear") {
		// ISO week number
		result = DatePartSpecifier::WEEK;
	} else if (specifier == "doy" || specifier == "dayofyear") {
		// day of the year (1-365/366)
		result = DatePartSpecifier::DOY;
	} else if (specifier == "quarter" || specifier == "quarters") {
		// quarter of the year (1-4)
		result = DatePartSpecifier::QUARTER;
	} else if (specifier == "yearweek") {
		// Combined isoyear and isoweek YYYYWW
		result = DatePartSpecifier::YEARWEEK;
	} else if (specifier == "isoyear") {
		// ISO year (first week of the year may be in previous year)
		result = DatePartSpecifier::ISOYEAR;
	} else if (specifier == "era") {
		result = DatePartSpecifier::ERA;
	} else if (specifier == "timezone") {
		result = DatePartSpecifier::TIMEZONE;
	} else if (specifier == "timezone_hour") {
		result = DatePartSpecifier::TIMEZONE_HOUR;
	} else if (specifier == "timezone_minute") {
		result = DatePartSpecifier::TIMEZONE_MINUTE;
	} else if (specifier == "julian" || specifier == "jd") {
		result = DatePartSpecifier::JULIAN_DAY;
	} else {
		return false;
	}
	return true;
}